

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.h
# Opt level: O0

bool __thiscall Assimp::ColladaMeshIndex::operator<(ColladaMeshIndex *this,ColladaMeshIndex *p)

{
  __type _Var1;
  ColladaMeshIndex *p_local;
  ColladaMeshIndex *this_local;
  
  _Var1 = std::operator==(&this->mMeshID,&p->mMeshID);
  if (_Var1) {
    if (this->mSubMesh == p->mSubMesh) {
      this_local._7_1_ = std::operator<(&this->mMaterial,&p->mMaterial);
    }
    else {
      this_local._7_1_ = this->mSubMesh < p->mSubMesh;
    }
  }
  else {
    this_local._7_1_ = std::operator<(&this->mMeshID,&p->mMeshID);
  }
  return this_local._7_1_;
}

Assistant:

bool operator < (const ColladaMeshIndex& p) const
    {
        if( mMeshID == p.mMeshID)
        {
            if( mSubMesh == p.mSubMesh)
                return mMaterial < p.mMaterial;
            else
                return mSubMesh < p.mSubMesh;
        } else
        {
            return mMeshID < p.mMeshID;
        }
    }